

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtMan.c
# Opt level: O2

Cgt_Man_t * Cgt_ManCreate(Aig_Man_t *pAig,Aig_Man_t *pCare,Cgt_Par_t *pPars)

{
  uint uVar1;
  Cgt_Man_t *pCVar2;
  Vec_Vec_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (0 < pAig->nRegs) {
    Aig_ManFanoutStart(pAig);
    Aig_ManSetCioIds(pAig);
    pCVar2 = (Cgt_Man_t *)calloc(1,0xd8);
    pCVar2->pPars = pPars;
    pCVar2->pAig = pAig;
    uVar1 = pAig->nRegs;
    pVVar3 = (Vec_Vec_t *)malloc(0x10);
    uVar6 = 8;
    if (6 < uVar1 - 1) {
      uVar6 = uVar1;
    }
    pVVar3->nCap = uVar6;
    uVar7 = 0;
    if (uVar6 == 0) {
      ppvVar4 = (void **)0x0;
    }
    else {
      ppvVar4 = (void **)malloc((long)(int)uVar6 << 3);
    }
    pVVar3->pArray = ppvVar4;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      pVVar5 = Vec_PtrAlloc(0);
      ppvVar4[uVar7] = pVVar5;
    }
    pVVar3->nSize = uVar1;
    pCVar2->vGatesAll = pVVar3;
    pVVar5 = Vec_PtrAlloc(1000);
    pCVar2->vFanout = pVVar5;
    pVVar5 = Vec_PtrAlloc(1000);
    pCVar2->vVisited = pVVar5;
    pCVar2->nPattWords = 0x10;
    if (pCare != (Aig_Man_t *)0x0) {
      if (pCare->nObjs[2] == pAig->nObjs[2]) {
        pCVar2->pCare = pCare;
        pVVar5 = Aig_ManSupportsInverse(pCare);
        pCVar2->vSuppsInv = (Vec_Vec_t *)pVVar5;
      }
      else {
        printf("The PI count of care (%d) and AIG (%d) differ. Careset is not used.\n");
      }
    }
    return pCVar2;
  }
  __assert_fail("Saig_ManRegNum(pAig) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtMan.c"
                ,0x31,"Cgt_Man_t *Cgt_ManCreate(Aig_Man_t *, Aig_Man_t *, Cgt_Par_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cgt_Man_t * Cgt_ManCreate( Aig_Man_t * pAig, Aig_Man_t * pCare, Cgt_Par_t * pPars )
{
    Cgt_Man_t * p;
    // prepare the sequential AIG
    assert( Saig_ManRegNum(pAig) > 0 );
    Aig_ManFanoutStart( pAig );
    Aig_ManSetCioIds( pAig );
    // create interpolation manager
    p = ABC_ALLOC( Cgt_Man_t, 1 ); 
    memset( p, 0, sizeof(Cgt_Man_t) );
    p->pPars      = pPars;
    p->pAig       = pAig;
    p->vGatesAll  = Vec_VecStart( Saig_ManRegNum(pAig) );
    p->vFanout    = Vec_PtrAlloc( 1000 );
    p->vVisited   = Vec_PtrAlloc( 1000 );
    p->nPattWords = 16;
    if ( pCare == NULL )
        return p;
    // check out the constraints
    if ( Aig_ManCiNum(pCare) != Aig_ManCiNum(pAig) )
    {
        printf( "The PI count of care (%d) and AIG (%d) differ. Careset is not used.\n", 
            Aig_ManCiNum(pCare), Aig_ManCiNum(pAig) );
        return p;
    }
    p->pCare = pCare;
    p->vSuppsInv = (Vec_Vec_t *)Aig_ManSupportsInverse( p->pCare );
    return p;
}